

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O3

void __thiscall
libchess::Position::generate_capture_promotions(Position *this,MoveList *move_list,Color stm)

{
  long lVar1;
  long lVar2;
  Move *pMVar3;
  iterator iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  Move local_44;
  undefined8 *local_40;
  ulong local_38;
  
  uVar7 = this->color_bb_[(int)stm.super_MetaValueType<int>.value_].value_ &
          this->piece_type_bb_[0].value_ &
          *(ulong *)(lookups::RANK_MASK +
                    (ulong)((uint)(stm.super_MetaValueType<int>.value_ == 0) * 0x28) + 8);
  if (uVar7 != 0) {
    local_38 = *(ulong *)((long)&this->color_bb_[0].value_ +
                         (ulong)((uint)(stm.super_MetaValueType<int>.value_ == 0) * 8));
    local_40 = &lookups::PAWN_ATTACKS + (long)(int)stm.super_MetaValueType<int>.value_ * 0x40;
    do {
      lVar1 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      for (uVar5 = local_40[lVar1] & local_38; uVar5 != 0; uVar5 = uVar5 & uVar5 - 1) {
        lVar2 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar6 = (int)lVar2 * 0x40;
        local_44.value_ = uVar6 + 0x3c000 + (uint)lVar1;
        iVar4._M_current =
             (move_list->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pMVar3 = (move_list->values_).
                 super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (iVar4._M_current == pMVar3) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar4,
                     &local_44);
          iVar4._M_current =
               (move_list->values_).
               super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pMVar3 = (move_list->values_).
                   super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          (iVar4._M_current)->value_ = local_44.value_;
          iVar4._M_current = iVar4._M_current + 1;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
        }
        uVar6 = uVar6 | (uint)lVar1;
        local_44.value_ = uVar6 | 0x39000;
        if (iVar4._M_current == pMVar3) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar4,
                     &local_44);
          iVar4._M_current =
               (move_list->values_).
               super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pMVar3 = (move_list->values_).
                   super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          (iVar4._M_current)->value_ = local_44.value_;
          iVar4._M_current = iVar4._M_current + 1;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
        }
        local_44.value_ = uVar6 | 0x3b000;
        if (iVar4._M_current == pMVar3) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar4,
                     &local_44);
          iVar4._M_current =
               (move_list->values_).
               super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pMVar3 = (move_list->values_).
                   super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          (iVar4._M_current)->value_ = local_44.value_;
          iVar4._M_current = iVar4._M_current + 1;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
        }
        local_44.value_ = uVar6 | 0x3a000;
        if (iVar4._M_current == pMVar3) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar4,
                     &local_44);
        }
        else {
          (iVar4._M_current)->value_ = local_44.value_;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      uVar7 = uVar7 & uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

inline void Position::generate_capture_promotions(MoveList& move_list, Color stm) const {
    Bitboard pawn_bb = piece_type_bb(constants::PAWN);
    pawn_bb &= color_bb(stm) & lookups::relative_rank_mask(constants::RANK_7, stm);
    Bitboard opp_occupancy = color_bb(!stm);
    while (pawn_bb) {
        Square from_sq = pawn_bb.forward_bitscan();
        pawn_bb.forward_popbit();
        Bitboard attacks_bb = lookups::pawn_attacks(from_sq, stm) & opp_occupancy;
        while (attacks_bb) {
            Square to_sq = attacks_bb.forward_bitscan();
            attacks_bb.forward_popbit();
            move_list.add(Move{from_sq, to_sq, constants::QUEEN, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::KNIGHT, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::ROOK, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::BISHOP, Move::Type::CAPTURE_PROMOTION});
        }
    }
}